

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Chapters::Atom::ShallowCopy(Atom *this,Atom *rhs)

{
  longlong lVar1;
  int iVar2;
  
  rhs->m_string_uid = this->m_string_uid;
  lVar1 = this->m_start_timecode;
  rhs->m_uid = this->m_uid;
  rhs->m_start_timecode = lVar1;
  rhs->m_stop_timecode = this->m_stop_timecode;
  rhs->m_displays = this->m_displays;
  iVar2 = this->m_displays_count;
  rhs->m_displays_size = this->m_displays_size;
  rhs->m_displays_count = iVar2;
  return;
}

Assistant:

void Chapters::Atom::ShallowCopy(Atom& rhs) const {
  rhs.m_string_uid = m_string_uid;
  rhs.m_uid = m_uid;
  rhs.m_start_timecode = m_start_timecode;
  rhs.m_stop_timecode = m_stop_timecode;

  rhs.m_displays = m_displays;
  rhs.m_displays_size = m_displays_size;
  rhs.m_displays_count = m_displays_count;
}